

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

int imagetoraw_common(opj_image_t *image,char *outfile,OPJ_BOOL big_endian)

{
  char *pcVar1;
  ushort local_6e;
  ushort local_6c;
  byte local_69;
  anon_union_2_2_132597f0_conflict uc16_1;
  anon_union_2_2_132597f0 uc16;
  int *piStack_68;
  uchar uc;
  int *ptr;
  int local_58;
  int mask;
  int curr;
  int row;
  int line;
  int fails;
  int h;
  int w;
  uint numcomps;
  uint compno;
  size_t res;
  FILE *rawFile;
  char *pcStack_20;
  OPJ_BOOL big_endian_local;
  char *outfile_local;
  opj_image_t *image_local;
  
  res = 0;
  rawFile._4_4_ = big_endian;
  pcStack_20 = outfile;
  outfile_local = (char *)image;
  if (image->numcomps * image->x1 * image->y1 == 0) {
    fprintf(_stderr,"\nError: invalid raw image parameters\n");
    image_local._4_4_ = 1;
  }
  else {
    h = image->numcomps;
    if (4 < (uint)h) {
      h = 4;
    }
    w = 1;
    while (((((uint)w < (uint)h && (image->comps->dx == image->comps[(uint)w].dx)) &&
            (image->comps->dy == image->comps[(uint)w].dy)) &&
           ((image->comps->prec == image->comps[(uint)w].prec &&
            (image->comps->sgnd == image->comps[(uint)w].sgnd))))) {
      w = w + 1;
    }
    if (w == h) {
      res = (size_t)fopen(outfile,"wb");
      if ((FILE *)res == (FILE *)0x0) {
        fprintf(_stderr,"Failed to open %s for writing !!\n",pcStack_20);
        image_local._4_4_ = 1;
      }
      else {
        row = 1;
        fprintf(_stdout,"Raw image characteristics: %d components\n",
                (ulong)*(uint *)(outfile_local + 0x10));
        for (w = 0; (uint)w < *(uint *)(outfile_local + 0x10); w = w + 1) {
          pcVar1 = "unsigned";
          if (*(int *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x20) == 1) {
            pcVar1 = "signed";
          }
          fprintf(_stdout,"Component %u characteristics: %dx%dx%d %s\n",(ulong)(uint)w,
                  (ulong)*(uint *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 8),
                  (ulong)*(uint *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0xc),
                  (ulong)*(uint *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x18),
                  pcVar1);
          fails = *(int *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 8);
          line = *(int *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0xc);
          if (*(uint *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x18) < 9) {
            if (*(int *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x20) == 1) {
              ptr._4_4_ = (1 << ((byte)*(undefined4 *)
                                        (*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 +
                                        0x18) & 0x1f)) + -1;
              piStack_68 = *(int **)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x30)
              ;
              for (curr = 0; curr < line; curr = curr + 1) {
                for (mask = 0; mask < fails; mask = mask + 1) {
                  local_58 = *piStack_68;
                  if (local_58 < 0x80) {
                    if (local_58 < -0x80) {
                      local_58 = -0x80;
                    }
                  }
                  else {
                    local_58 = 0x7f;
                  }
                  local_69 = (byte)local_58 & (byte)ptr._4_4_;
                  _numcomps = fwrite(&local_69,1,1,(FILE *)res);
                  if (_numcomps == 0) {
                    fprintf(_stderr,"failed to write 1 byte for %s\n",pcStack_20);
                    goto LAB_0010b0b4;
                  }
                  piStack_68 = piStack_68 + 1;
                }
              }
            }
            else if (*(int *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x20) == 0)
            {
              ptr._4_4_ = (1 << ((byte)*(undefined4 *)
                                        (*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 +
                                        0x18) & 0x1f)) + -1;
              piStack_68 = *(int **)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x30)
              ;
              for (curr = 0; curr < line; curr = curr + 1) {
                for (mask = 0; mask < fails; mask = mask + 1) {
                  local_58 = *piStack_68;
                  if (local_58 < 0x100) {
                    if (local_58 < 0) {
                      local_58 = 0;
                    }
                  }
                  else {
                    local_58 = 0xff;
                  }
                  local_69 = (byte)local_58 & (byte)ptr._4_4_;
                  _numcomps = fwrite(&local_69,1,1,(FILE *)res);
                  if (_numcomps == 0) {
                    fprintf(_stderr,"failed to write 1 byte for %s\n",pcStack_20);
                    goto LAB_0010b0b4;
                  }
                  piStack_68 = piStack_68 + 1;
                }
              }
            }
          }
          else {
            if (0x10 < *(uint *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x18)) {
              if (*(uint *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x18) < 0x21)
              {
                fprintf(_stderr,"More than 16 bits per component not handled yet\n");
              }
              else {
                fprintf(_stderr,"Error: invalid precision: %d\n",
                        (ulong)*(uint *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 +
                                        0x18));
              }
              goto LAB_0010b0b4;
            }
            if (*(int *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x20) == 1) {
              ptr._4_4_ = (1 << ((byte)*(undefined4 *)
                                        (*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 +
                                        0x18) & 0x1f)) + -1;
              piStack_68 = *(int **)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x30)
              ;
              for (curr = 0; curr < line; curr = curr + 1) {
                for (mask = 0; mask < fails; mask = mask + 1) {
                  local_58 = *piStack_68;
                  if (local_58 < 0x8000) {
                    if (local_58 < -0x8000) {
                      local_58 = -0x8000;
                    }
                  }
                  else {
                    local_58 = 0x7fff;
                  }
                  local_6c = (ushort)local_58 & (ushort)ptr._4_4_;
                  _numcomps = fwrite(&local_6c,1,2,(FILE *)res);
                  if (_numcomps < 2) {
                    fprintf(_stderr,"failed to write 2 byte for %s\n",pcStack_20);
                    goto LAB_0010b0b4;
                  }
                  piStack_68 = piStack_68 + 1;
                }
              }
            }
            else if (*(int *)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x20) == 0)
            {
              ptr._4_4_ = (1 << ((byte)*(undefined4 *)
                                        (*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 +
                                        0x18) & 0x1f)) + -1;
              piStack_68 = *(int **)(*(long *)(outfile_local + 0x18) + (ulong)(uint)w * 0x40 + 0x30)
              ;
              for (curr = 0; curr < line; curr = curr + 1) {
                for (mask = 0; mask < fails; mask = mask + 1) {
                  local_58 = *piStack_68;
                  if (local_58 < 0x10000) {
                    if (local_58 < 0) {
                      local_58 = 0;
                    }
                  }
                  else {
                    local_58 = 0xffff;
                  }
                  local_6e = (ushort)local_58 & (ushort)ptr._4_4_;
                  _numcomps = fwrite(&local_6e,1,2,(FILE *)res);
                  if (_numcomps < 2) {
                    fprintf(_stderr,"failed to write 2 byte for %s\n",pcStack_20);
                    goto LAB_0010b0b4;
                  }
                  piStack_68 = piStack_68 + 1;
                }
              }
            }
          }
        }
        row = 0;
LAB_0010b0b4:
        fclose((FILE *)res);
        image_local._4_4_ = row;
      }
    }
    else {
      fprintf(_stderr,
              "imagetoraw_common: All components shall have the same subsampling, same bit depth, same sign.\n"
             );
      fprintf(_stderr,"\tAborting\n");
      image_local._4_4_ = 1;
    }
  }
  return image_local._4_4_;
}

Assistant:

static int imagetoraw_common(opj_image_t * image, const char *outfile,
                             OPJ_BOOL big_endian)
{
    FILE *rawFile = NULL;
    size_t res;
    unsigned int compno, numcomps;
    int w, h, fails;
    int line, row, curr, mask;
    int *ptr;
    unsigned char uc;
    (void)big_endian;

    if ((image->numcomps * image->x1 * image->y1) == 0) {
        fprintf(stderr, "\nError: invalid raw image parameters\n");
        return 1;
    }

    numcomps = image->numcomps;

    if (numcomps > 4) {
        numcomps = 4;
    }

    for (compno = 1; compno < numcomps; ++compno) {
        if (image->comps[0].dx != image->comps[compno].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[compno].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[compno].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[compno].sgnd) {
            break;
        }
    }
    if (compno != numcomps) {
        fprintf(stderr,
                "imagetoraw_common: All components shall have the same subsampling, same bit depth, same sign.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }

    rawFile = fopen(outfile, "wb");
    if (!rawFile) {
        fprintf(stderr, "Failed to open %s for writing !!\n", outfile);
        return 1;
    }

    fails = 1;
    fprintf(stdout, "Raw image characteristics: %d components\n", image->numcomps);

    for (compno = 0; compno < image->numcomps; compno++) {
        fprintf(stdout, "Component %u characteristics: %dx%dx%d %s\n", compno,
                image->comps[compno].w,
                image->comps[compno].h, image->comps[compno].prec,
                image->comps[compno].sgnd == 1 ? "signed" : "unsigned");

        w = (int)image->comps[compno].w;
        h = (int)image->comps[compno].h;

        if (image->comps[compno].prec <= 8) {
            if (image->comps[compno].sgnd == 1) {
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 127) {
                            curr = 127;
                        } else if (curr < -128) {
                            curr = -128;
                        }
                        uc = (unsigned char)(curr & mask);
                        res = fwrite(&uc, 1, 1, rawFile);
                        if (res < 1) {
                            fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            } else if (image->comps[compno].sgnd == 0) {
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 255) {
                            curr = 255;
                        } else if (curr < 0) {
                            curr = 0;
                        }
                        uc = (unsigned char)(curr & mask);
                        res = fwrite(&uc, 1, 1, rawFile);
                        if (res < 1) {
                            fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            }
        } else if (image->comps[compno].prec <= 16) {
            if (image->comps[compno].sgnd == 1) {
                union {
                    signed short val;
                    signed char vals[2];
                } uc16;
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 32767) {
                            curr = 32767;
                        } else if (curr < -32768) {
                            curr = -32768;
                        }
                        uc16.val = (signed short)(curr & mask);
                        res = fwrite(uc16.vals, 1, 2, rawFile);
                        if (res < 2) {
                            fprintf(stderr, "failed to write 2 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            } else if (image->comps[compno].sgnd == 0) {
                union {
                    unsigned short val;
                    unsigned char vals[2];
                } uc16;
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 65535) {
                            curr = 65535;
                        } else if (curr < 0) {
                            curr = 0;
                        }
                        uc16.val = (unsigned short)(curr & mask);
                        res = fwrite(uc16.vals, 1, 2, rawFile);
                        if (res < 2) {
                            fprintf(stderr, "failed to write 2 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            }
        } else if (image->comps[compno].prec <= 32) {
            fprintf(stderr, "More than 16 bits per component not handled yet\n");
            goto fin;
        } else {
            fprintf(stderr, "Error: invalid precision: %d\n", image->comps[compno].prec);
            goto fin;
        }
    }
    fails = 0;
fin:
    fclose(rawFile);
    return fails;
}